

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O3

int kj::TlsPrivateKey::passwordCallback(char *buf,int size,int rwflag,void *u)

{
  int iVar1;
  ulong uVar2;
  
  iVar1 = 0;
  if (*u == '\x01') {
    uVar2 = *(long *)((long)u + 0x10) - 1;
    if ((ulong)(long)size <= uVar2) {
      uVar2 = (long)size;
    }
    iVar1 = (int)uVar2;
    memcpy(buf,*(void **)((long)u + 8),(long)iVar1);
  }
  return iVar1;
}

Assistant:

int TlsPrivateKey::passwordCallback(char* buf, int size, int rwflag, void* u) {
  auto& password = *reinterpret_cast<kj::Maybe<kj::StringPtr>*>(u);

  KJ_IF_SOME(p, password) {
    int result = kj::min(p.size(), size);
    memcpy(buf, p.begin(), result);
    return result;
  } else {
    return 0;
  }
}